

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

WaitOrderStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitOrderStatementSyntax,slang::syntax::WaitOrderStatementSyntax_const&>
          (BumpAllocator *this,WaitOrderStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  WaitOrderStatementSyntax *pWVar13;
  
  pWVar13 = (WaitOrderStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WaitOrderStatementSyntax *)this->endPtr < pWVar13 + 1) {
    pWVar13 = (WaitOrderStatementSyntax *)allocateSlow(this,200,8);
  }
  else {
    this->head->current = (byte *)(pWVar13 + 1);
  }
  (pWVar13->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pWVar13->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pWVar13->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pWVar13->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pWVar13->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar5;
  (pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00698df0;
  (pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pWVar13->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pWVar13->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pWVar13->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00698d40;
  TVar9 = (args->wait_order).kind;
  uVar10 = (args->wait_order).field_0x2;
  NVar11.raw = (args->wait_order).numFlags.raw;
  uVar12 = (args->wait_order).rawLen;
  pIVar3 = (args->wait_order).info;
  uVar6 = (args->openParen).field_0x2;
  NVar7.raw = (args->openParen).numFlags.raw;
  uVar8 = (args->openParen).rawLen;
  pIVar4 = (args->openParen).info;
  (pWVar13->openParen).kind = (args->openParen).kind;
  (pWVar13->openParen).field_0x2 = uVar6;
  (pWVar13->openParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pWVar13->openParen).rawLen = uVar8;
  (pWVar13->openParen).info = pIVar4;
  (pWVar13->wait_order).kind = TVar9;
  (pWVar13->wait_order).field_0x2 = uVar10;
  (pWVar13->wait_order).numFlags = (NumericTokenFlags)NVar11.raw;
  (pWVar13->wait_order).rawLen = uVar12;
  (pWVar13->wait_order).info = pIVar3;
  uVar5 = *(undefined4 *)&(args->names).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->names).super_SyntaxListBase.super_SyntaxNode.parent;
  (pWVar13->names).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->names).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pWVar13->names).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pWVar13->names).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pWVar13->names).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->names).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pWVar13->names).super_SyntaxListBase.childCount = (args->names).super_SyntaxListBase.childCount;
  (pWVar13->names).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006990f8;
  sVar2 = (args->names).elements._M_extent._M_extent_value;
  (pWVar13->names).elements._M_ptr = (args->names).elements._M_ptr;
  (pWVar13->names).elements._M_extent._M_extent_value = sVar2;
  uVar6 = (args->closeParen).field_0x2;
  NVar7.raw = (args->closeParen).numFlags.raw;
  uVar8 = (args->closeParen).rawLen;
  pIVar3 = (args->closeParen).info;
  (pWVar13->closeParen).kind = (args->closeParen).kind;
  (pWVar13->closeParen).field_0x2 = uVar6;
  (pWVar13->closeParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pWVar13->closeParen).rawLen = uVar8;
  (pWVar13->closeParen).info = pIVar3;
  (pWVar13->action).ptr = (args->action).ptr;
  return pWVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }